

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder.c
# Opt level: O3

lzma_ret block_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  int iVar1;
  lzma_check type;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  uint32_t uVar7;
  lzma_ret lVar8;
  ulong uVar9;
  ulong uVar10;
  
  sVar2 = *in_pos;
  if (0x7fffffffffffffffU - *(long *)((long)coder_ptr + 0x60) < in_size - sVar2) {
    return LZMA_DATA_ERROR;
  }
  iVar1 = *(int *)((long)coder_ptr + 0x50);
  if (iVar1 == 0) {
    sVar3 = *out_pos;
    lVar8 = (**(code **)((long)coder_ptr + 0x18))
                      (*coder_ptr,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    if (0x7ffffffffffffbbcU - *(long *)((long)coder_ptr + 0x58) < *out_pos - sVar3) {
      return LZMA_DATA_ERROR;
    }
    sVar4 = *in_pos;
    *(size_t *)((long)coder_ptr + 0x58) = *(long *)((long)coder_ptr + 0x58) + (*out_pos - sVar3);
    *(long *)((long)coder_ptr + 0x60) = *(long *)((long)coder_ptr + 0x60) + (sVar4 - sVar2);
    lzma_check_update((lzma_check_state *)((long)coder_ptr + 0x70),
                      *(lzma_check *)(*(long *)((long)coder_ptr + 0x48) + 8),in + sVar2,
                      sVar4 - sVar2);
    if (action == LZMA_SYNC_FLUSH || lVar8 != LZMA_STREAM_END) {
      return lVar8;
    }
    if (*in_pos != in_size) {
      __assert_fail("*in_pos == in_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/block_encoder.c"
                    ,0x56,
                    "lzma_ret block_encode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    if (action != LZMA_FINISH) {
      __assert_fail("action == LZMA_FINISH",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/block_encoder.c"
                    ,0x57,
                    "lzma_ret block_encode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    uVar6 = *(undefined8 *)((long)coder_ptr + 0x60);
    lVar5 = *(long *)((long)coder_ptr + 0x48);
    uVar9 = *(ulong *)((long)coder_ptr + 0x58);
    *(undefined8 *)(lVar5 + 0x10) = *(undefined8 *)((long)coder_ptr + 0x58);
    *(undefined8 *)(lVar5 + 0x18) = uVar6;
    *(undefined4 *)((long)coder_ptr + 0x50) = 1;
  }
  else {
    if (iVar1 == 2) goto LAB_0046d41b;
    if (iVar1 != 1) {
      return LZMA_PROG_ERROR;
    }
    uVar9 = *(ulong *)((long)coder_ptr + 0x58);
  }
  if ((uVar9 & 3) != 0) {
    uVar10 = *out_pos;
    do {
      uVar9 = uVar9 + 1;
      if (out_size <= uVar10) {
        return LZMA_OK;
      }
      out[uVar10] = '\0';
      uVar10 = uVar10 + 1;
      *out_pos = uVar10;
      *(ulong *)((long)coder_ptr + 0x58) = uVar9;
    } while ((uVar9 & 3) != 0);
  }
  type = *(lzma_check *)(*(long *)((long)coder_ptr + 0x48) + 8);
  if (type == LZMA_CHECK_NONE) {
    return LZMA_STREAM_END;
  }
  lzma_check_finish((lzma_check_state *)((long)coder_ptr + 0x70),type);
  *(undefined4 *)((long)coder_ptr + 0x50) = 2;
LAB_0046d41b:
  uVar7 = lzma_check_size(*(lzma_check *)(*(long *)((long)coder_ptr + 0x48) + 8));
  uVar9 = (ulong)uVar7;
  lzma_bufcpy((uint8_t *)((long)coder_ptr + 0x70),(size_t *)((long)coder_ptr + 0x68),uVar9,out,
              out_pos,out_size);
  if (uVar9 <= *(ulong *)((long)coder_ptr + 0x68)) {
    memcpy((void *)(*(long *)((long)coder_ptr + 0x48) + 0x28),(uint8_t *)((long)coder_ptr + 0x70),
           uVar9);
    return LZMA_STREAM_END;
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
block_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_block_coder *coder = coder_ptr;

	// Check that our amount of input stays in proper limits.
	if (LZMA_VLI_MAX - coder->uncompressed_size < in_size - *in_pos)
		return LZMA_DATA_ERROR;

	switch (coder->sequence) {
	case SEQ_CODE: {
		const size_t in_start = *in_pos;
		const size_t out_start = *out_pos;

		const lzma_ret ret = coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

		const size_t in_used = *in_pos - in_start;
		const size_t out_used = *out_pos - out_start;

		if (COMPRESSED_SIZE_MAX - coder->compressed_size < out_used)
			return LZMA_DATA_ERROR;

		coder->compressed_size += out_used;

		// No need to check for overflow because we have already
		// checked it at the beginning of this function.
		coder->uncompressed_size += in_used;

		lzma_check_update(&coder->check, coder->block->check,
				in + in_start, in_used);

		if (ret != LZMA_STREAM_END || action == LZMA_SYNC_FLUSH)
			return ret;

		assert(*in_pos == in_size);
		assert(action == LZMA_FINISH);

		// Copy the values into coder->block. The caller
		// may use this information to construct Index.
		coder->block->compressed_size = coder->compressed_size;
		coder->block->uncompressed_size = coder->uncompressed_size;

		coder->sequence = SEQ_PADDING;
	}

	// Fall through

	case SEQ_PADDING:
		// Pad Compressed Data to a multiple of four bytes. We can
		// use coder->compressed_size for this since we don't need
		// it for anything else anymore.
		while (coder->compressed_size & 3) {
			if (*out_pos >= out_size)
				return LZMA_OK;

			out[*out_pos] = 0x00;
			++*out_pos;
			++coder->compressed_size;
		}

		if (coder->block->check == LZMA_CHECK_NONE)
			return LZMA_STREAM_END;

		lzma_check_finish(&coder->check, coder->block->check);

		coder->sequence = SEQ_CHECK;

	// Fall through

	case SEQ_CHECK: {
		const size_t check_size = lzma_check_size(coder->block->check);
		lzma_bufcpy(coder->check.buffer.u8, &coder->pos, check_size,
				out, out_pos, out_size);
		if (coder->pos < check_size)
			return LZMA_OK;

		memcpy(coder->block->raw_check, coder->check.buffer.u8,
				check_size);
		return LZMA_STREAM_END;
	}
	}

	return LZMA_PROG_ERROR;
}